

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mi.h
# Opt level: O0

bool __thiscall
GF2::MI<8UL,_GF2::MOGrevlex<8UL>_>::Reduce
          (MI<8UL,_GF2::MOGrevlex<8UL>_> *this,MP<8UL,_GF2::MOGrevlex<8UL>_> *polyRight)

{
  bool bVar1;
  int iVar2;
  const_iterator this_00;
  const_iterator this_01;
  MP<8UL,_GF2::MOGrevlex<8UL>_> *in_RDI;
  const_iterator iterPoly;
  MP<8UL,_GF2::MOGrevlex<8UL>_> poly;
  MM<8UL> lm;
  bool changed;
  Geobucket<2UL> gb;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  Geobucket<2UL> *in_stack_ffffffffffffff30;
  MP<8UL,_GF2::MOGrevlex<8UL>_> *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  MM<8UL> *mRight;
  undefined4 in_stack_ffffffffffffff54;
  const_iterator in_stack_ffffffffffffff60;
  const_iterator in_stack_ffffffffffffff68;
  byte local_41;
  
  MP<8UL,_GF2::MOGrevlex<8UL>_>::Geobucket<2UL>::Geobucket
            ((Geobucket<2UL> *)in_stack_ffffffffffffff60._M_node,in_RDI);
  MP<8UL,_GF2::MOGrevlex<8UL>_>::SetEmpty((MP<8UL,_GF2::MOGrevlex<8UL>_> *)0x1ce8d6);
  local_41 = 0;
  MM<8UL>::MM((MM<8UL> *)0x1ce8eb);
  MP<8UL,_GF2::MOGrevlex<8UL>_>::MP
            ((MP<8UL,_GF2::MOGrevlex<8UL>_> *)in_stack_ffffffffffffff30,
             (MOGrevlex<8UL> *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
  do {
    bVar1 = MP<8UL,_GF2::MOGrevlex<8UL>_>::Geobucket<2UL>::PopLM
                      ((Geobucket<2UL> *)in_stack_ffffffffffffff60._M_node,(MM<8UL> *)in_RDI);
    in_stack_ffffffffffffff54 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff54);
    if (!bVar1) {
      MP<8UL,_GF2::MOGrevlex<8UL>_>::~MP((MP<8UL,_GF2::MOGrevlex<8UL>_> *)0x1ceb10);
      MP<8UL,_GF2::MOGrevlex<8UL>_>::Geobucket<2UL>::~Geobucket(in_stack_ffffffffffffff30);
      return (bool)(local_41 & 1);
    }
    this_00 = std::__cxx11::
              list<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
              ::begin((list<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                       *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
    while( true ) {
      this_01 = std::__cxx11::
                list<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                ::end((list<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                       *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
      bVar1 = std::operator!=((_Self *)&stack0xffffffffffffff78,(_Self *)&stack0xffffffffffffff70);
      if (!bVar1) break;
      mRight = (MM<8UL> *)&in_RDI->field_0x18;
      std::_List_const_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>::operator->
                ((_List_const_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_> *)0x1ce97a);
      MP<8UL,_GF2::MOGrevlex<8UL>_>::LM((MP<8UL,_GF2::MOGrevlex<8UL>_> *)in_stack_ffffffffffffff30);
      iVar2 = MOGrevlex<8UL>::Compare
                        ((MOGrevlex<8UL> *)this_00._M_node,(MM<8UL> *)this_01._M_node,
                         (MM<8UL> *)in_stack_ffffffffffffff68._M_node);
      if (0 < iVar2) {
        in_stack_ffffffffffffff68 =
             std::__cxx11::
             list<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
             ::end((list<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                    *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
        break;
      }
      std::_List_const_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>::operator->
                ((_List_const_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_> *)0x1cea04);
      MP<8UL,_GF2::MOGrevlex<8UL>_>::LM((MP<8UL,_GF2::MOGrevlex<8UL>_> *)in_stack_ffffffffffffff30);
      in_stack_ffffffffffffff47 =
           MM<8ul>::operator|((MM<8UL> *)in_stack_ffffffffffffff30,
                              (MM<8UL> *)
                              CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
      if ((bool)in_stack_ffffffffffffff47) {
        local_41 = 1;
        std::_List_const_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>::operator*
                  ((_List_const_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_> *)
                   in_stack_ffffffffffffff30);
        in_stack_ffffffffffffff38 =
             MP<8UL,_GF2::MOGrevlex<8UL>_>::operator=
                       ((MP<8UL,_GF2::MOGrevlex<8UL>_> *)in_stack_ffffffffffffff30,
                        (MP<8UL,_GF2::MOGrevlex<8UL>_> *)
                        CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
        MP<8UL,_GF2::MOGrevlex<8UL>_>::PopLM((MP<8UL,_GF2::MOGrevlex<8UL>_> *)0x1cea5c);
        std::_List_const_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>::operator->
                  ((_List_const_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_> *)0x1cea66);
        MP<8UL,_GF2::MOGrevlex<8UL>_>::LM
                  ((MP<8UL,_GF2::MOGrevlex<8UL>_> *)in_stack_ffffffffffffff30);
        MM<8UL>::operator/=((MM<8UL> *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40)
                            ,(MM<8UL> *)in_stack_ffffffffffffff38);
        in_stack_ffffffffffffff30 =
             (Geobucket<2UL> *)
             MP<8UL,_GF2::MOGrevlex<8UL>_>::operator*=
                       ((MP<8UL,_GF2::MOGrevlex<8UL>_> *)CONCAT44(in_stack_ffffffffffffff54,iVar2),
                        mRight);
        MP<8UL,_GF2::MOGrevlex<8UL>_>::Geobucket<2UL>::SymDiffSplice
                  ((Geobucket<2UL> *)this_01._M_node,
                   (MP<8UL,_GF2::MOGrevlex<8UL>_> *)in_stack_ffffffffffffff68._M_node);
        break;
      }
      std::_List_const_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>::operator++
                ((_List_const_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_> *)
                 &stack0xffffffffffffff78);
    }
    in_stack_ffffffffffffff60 =
         std::__cxx11::
         list<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
         ::end((list<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
    bVar1 = std::operator==((_Self *)&stack0xffffffffffffff78,(_Self *)&stack0xffffffffffffff60);
    if (bVar1) {
      std::__cxx11::list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>::push_back
                ((list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_> *)
                 CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                 (value_type *)in_stack_ffffffffffffff38);
    }
  } while( true );
}

Assistant:

bool Reduce(MP<_n, _O>& polyRight) const
	{	
		typename MP<_n, _O>::template Geobucket<2> gb(polyRight);
		// будем сохранять в polyRight остаток
		polyRight.SetEmpty();
		// цикл деления
		bool changed = false;
		MM<_n> lm;
		MP<_n, _O> poly(_order);
		while (gb.PopLM(lm))
		{
			// двигаемся от младших многочленов системы к старшим
			const_iterator iterPoly = begin();
			for (; iterPoly != end(); ++iterPoly)
			{
				// прекращаем заведомо нерезультативные итерации
				if (_order.Compare(iterPoly->LM(), lm) > 0)
				{
					iterPoly = end();
					break;
				}
				// делимость старших мономов?
				if (iterPoly->LM() | lm)
				{
					changed = true;
					// готовим множитель
					(poly = *iterPoly).PopLM();
					// перемножаем и добавляем в geobucket
					gb.SymDiffSplice(poly *= (lm /= iterPoly->LM()));
					// все сначала
					break;
				}
			}
			// lm не делится ни на один из старших многочленов системы,
			// поэтому заносим lm в остаток
			if (iterPoly == end()) polyRight.push_back(lm);
		}
		return changed;
	}